

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FOCC-OTA-cs16btech11038.cpp
# Opt level: O0

ssize_t __thiscall FOCC_OTA::read(FOCC_OTA *this,int __fd,void *__buf,size_t __nbytes)

{
  uint uVar1;
  value_type pDVar2;
  char cVar3;
  reference ppDVar4;
  mapped_type *ppTVar5;
  pair<std::_Rb_tree_const_iterator<Transaction_*>,_bool> pVar6;
  DataItem *curItem;
  Transaction *cur;
  int *store_local;
  int dIdx_local;
  int tid_local;
  FOCC_OTA *this_local;
  
  store_local._0_4_ = (int)__buf;
  cur = (Transaction *)__nbytes;
  store_local._4_4_ = __fd;
  _dIdx_local = this;
  std::shared_mutex::lock_shared(&this->scheduler_lock);
  ppDVar4 = std::vector<DataItem_*,_std::allocator<DataItem_*>_>::operator[]
                      (&this->dataItems,(long)(int)store_local);
  std::mutex::lock(&(*ppDVar4)->lock);
  ppTVar5 = std::
            map<int,_Transaction_*,_std::less<int>,_std::allocator<std::pair<const_int,_Transaction_*>_>_>
            ::operator[](&this->transactions,(key_type *)((long)&store_local + 4));
  curItem = (DataItem *)*ppTVar5;
  std::mutex::lock(&((mapped_type)curItem)->t_status_mtx);
  cVar3 = Transaction::getStatus((Transaction *)curItem);
  if (cVar3 == 'a') {
    ppDVar4 = std::vector<DataItem_*,_std::allocator<DataItem_*>_>::operator[]
                        (&this->dataItems,(long)(int)store_local);
    std::set<Transaction_*,_TransCompare,_std::allocator<Transaction_*>_>::erase
              (&(*ppDVar4)->read_list,(key_type *)&curItem);
    std::mutex::unlock((mutex *)&(curItem->read_list)._M_t._M_impl.super__Rb_tree_header);
    ppDVar4 = std::vector<DataItem_*,_std::allocator<DataItem_*>_>::operator[]
                        (&this->dataItems,(long)(int)store_local);
    std::mutex::unlock(&(*ppDVar4)->lock);
    std::shared_mutex::unlock_shared(&this->scheduler_lock);
    this_local._4_4_ = 0xfffffffe;
  }
  else {
    ppDVar4 = std::vector<DataItem_*,_std::allocator<DataItem_*>_>::operator[]
                        (&this->dataItems,(long)(int)store_local);
    pDVar2 = *ppDVar4;
    pVar6 = std::set<Transaction_*,_TransCompare,_std::allocator<Transaction_*>_>::insert
                      (&pDVar2->read_list,(value_type *)&curItem);
    uVar1 = pDVar2->value;
    *(uint *)cur = uVar1;
    Transaction::read((Transaction *)curItem,(int)store_local,pVar6._8_8_,(ulong)uVar1);
    std::mutex::unlock((mutex *)&(curItem->read_list)._M_t._M_impl.super__Rb_tree_header);
    ppDVar4 = std::vector<DataItem_*,_std::allocator<DataItem_*>_>::operator[]
                        (&this->dataItems,(long)(int)store_local);
    std::mutex::unlock(&(*ppDVar4)->lock);
    std::shared_mutex::unlock_shared(&this->scheduler_lock);
    this_local._4_4_ = 0;
  }
  return (ulong)this_local._4_4_;
}

Assistant:

int FOCC_OTA::read(int tid, int dIdx, int *store) {
    scheduler_lock.lock_shared();
    dataItems[dIdx]->lock.lock();

    Transaction *cur = transactions[tid];
    cur->t_status_mtx.lock();

    if(cur->getStatus()=='a'){

        // remove this transaction from the read list of this data item.
        dataItems[dIdx]->read_list.erase(cur);

        cur->t_status_mtx.unlock();
        dataItems[dIdx]->lock.unlock();
        scheduler_lock.unlock_shared();

        return -2;
    }

    DataItem* curItem = dataItems[dIdx];
    curItem->read_list.insert(cur);
    *store = curItem->value;
    // This function just adds dIdx to the readSet!
    cur->read(dIdx);

    cur->t_status_mtx.unlock();
    dataItems[dIdx]->lock.unlock();
    scheduler_lock.unlock_shared();

    return 0;
}